

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteSpherical::Initialize
          (ChLinkRevoluteSpherical *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,ChCoordsys<double> *csys,double distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  element_type *peVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ChBodyFrame *pCVar12;
  ChBodyFrame *pCVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double local_38;
  double dStack_30;
  double local_28;
  
  peVar5 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar13 = &peVar5->super_ChBodyFrame;
  if (peVar5 == (element_type *)0x0) {
    pCVar13 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar13;
  peVar5 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar12 = &peVar5->super_ChBodyFrame;
  if (peVar5 == (element_type *)0x0) {
    pCVar12 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar12;
  iVar10 = (*(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar11 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var,iVar10),
             (ChVariables *)CONCAT44(extraout_var_00,iVar11));
  iVar10 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar11 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_01,iVar10),
             (ChVariables *)CONCAT44(extraout_var_02,iVar11));
  dVar1 = (csys->rot).m_data[1];
  dVar2 = (csys->rot).m_data[0];
  dVar3 = (csys->rot).m_data[2];
  pCVar13 = (this->super_ChLink).Body1;
  dVar4 = (csys->rot).m_data[3];
  ChTransform<double>::TransformParentToLocal
            (&csys->pos,&(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  if ((ChVector<double> *)&local_38 != &this->m_pos1) {
    (this->m_pos1).m_data[0] = local_38;
    (this->m_pos1).m_data[1] = dStack_30;
    (this->m_pos1).m_data[2] = local_28;
  }
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar3;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar4;
  pCVar13 = (this->super_ChLink).Body1;
  pCVar12 = (this->super_ChLink).Body2;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar2 * dVar3;
  auVar6 = vfmadd213sd_fma(auVar28,auVar30,auVar26);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar2 * dVar1;
  auVar9 = vfmsub231sd_fma(auVar23,auVar33,auVar28);
  auVar16 = vfmsub231sd_fma(auVar26,auVar30,auVar28);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4 * dVar4;
  auVar8 = vfmadd231sd_fma(auVar14,auVar32,auVar32);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar2 * dVar4;
  auVar14 = vfmadd231sd_fma(auVar29,auVar30,auVar33);
  dVar2 = auVar9._0_8_ + auVar9._0_8_;
  auVar9 = vfmadd213sd_fma(auVar8,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  dVar3 = auVar6._0_8_ + auVar6._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1 * dVar1;
  auVar6 = vfmadd231sd_fma(auVar31,auVar32,auVar32);
  auVar7 = vfmadd213sd_fma(auVar6,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  auVar21._0_8_ =
       dVar2 * (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  auVar21._8_8_ =
       dVar2 * (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar24._8_8_ = dVar3;
  auVar24._0_8_ = dVar3;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       dVar2 * (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar3;
  auVar15 = vfmadd231sd_fma(auVar18,auVar27,auVar6);
  auVar6 = vfmadd132pd_fma(auVar24,auVar21,
                           *(undefined1 (*) [16])
                            (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar8 = vfmadd231sd_fma(auVar15,auVar9,auVar8);
  auVar15._0_8_ = auVar9._0_8_;
  auVar15._8_8_ = auVar15._0_8_;
  auVar6 = vfmadd132pd_fma(auVar15,auVar6,
                           *(undefined1 (*) [16])
                            ((pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 6));
  *(undefined1 (*) [16])(this->m_dir1).m_data = auVar6;
  (this->m_dir1).m_data[2] = auVar8._0_8_;
  dVar1 = ((auVar14._0_8_ + auVar14._0_8_) * distance + (csys->pos).m_data[1]) -
          (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  dVar2 = (auVar7._0_8_ * distance + (csys->pos).m_data[0]) -
          (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar3 = ((auVar16._0_8_ + auVar16._0_8_) * distance + (csys->pos).m_data[2]) -
          (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       dVar1 * (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar6 = vfmadd231sd_fma(auVar25,auVar19,auVar9);
  auVar22._0_8_ =
       dVar1 * (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  auVar22._8_8_ =
       dVar1 * (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar20._8_8_ = dVar2;
  auVar20._0_8_ = dVar2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar3;
  auVar8 = vfmadd231sd_fma(auVar6,auVar16,auVar7);
  auVar17._8_8_ = dVar3;
  auVar17._0_8_ = dVar3;
  auVar6 = vfmadd132pd_fma(auVar20,auVar22,
                           *(undefined1 (*) [16])
                            (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar6 = vfmadd132pd_fma(auVar17,auVar6,
                           *(undefined1 (*) [16])
                            ((pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 6));
  *(undefined1 (*) [16])(this->m_pos2).m_data = auVar6;
  (this->m_pos2).m_data[2] = auVar8._0_8_;
  this->m_dist = distance;
  this->m_cur_dist = distance;
  this->m_cur_dot = 0.0;
  return;
}

Assistant:

void ChLinkRevoluteSpherical::Initialize(std::shared_ptr<ChBody> body1,
                                         std::shared_ptr<ChBody> body2,
                                         const ChCoordsys<>& csys,
                                         double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> x_Axis = csys.rot.GetXaxis();
    ChVector<> z_axis = csys.rot.GetZaxis();

    m_pos1 = Body1->TransformPointParentToLocal(csys.pos);
    m_dir1 = Body1->TransformDirectionParentToLocal(z_axis);
    m_pos2 = Body2->TransformPointParentToLocal(csys.pos + distance * x_Axis);

    m_dist = distance;
    m_cur_dist = distance;
    m_cur_dot = 0;
}